

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_3_ptr_mips
               (TCGContext_conflict3 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,TCGv_ptr ptr
               ,uint32_t oprsz,uint32_t maxsz,int32_t data,undefined1 *fn)

{
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  TCGv_ptr ret_01;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o;
  
  val = simd_desc_mips(oprsz,maxsz,data);
  pTVar1 = tcg_const_i32_mips(tcg_ctx,val);
  ret = tcg_temp_new_ptr(tcg_ctx);
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  ret_01 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_mips(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_i64_mips(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(ulong)aofs);
  tcg_gen_addi_i64_mips(tcg_ctx,(TCGv_i64)ret_01,(TCGv_i64)tcg_ctx->cpu_env,(ulong)bofs);
  (*(code *)fn)(tcg_ctx,ret,ret_00,ret_01,ptr,pTVar1);
  tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_3_ptr(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                        TCGv_ptr ptr, uint32_t oprsz, uint32_t maxsz,
                        int32_t data, gen_helper_gvec_3_ptr *fn)
{
    TCGv_ptr a0, a1, a2;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);
    a2 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);
    tcg_gen_addi_ptr(tcg_ctx, a2, tcg_ctx->cpu_env, bofs);

    fn(tcg_ctx, a0, a1, a2, ptr, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_ptr(tcg_ctx, a2);
    tcg_temp_free_i32(tcg_ctx, desc);
}